

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O3

DeviceBuilder * __thiscall
vkb::DeviceBuilder::custom_queue_setup
          (DeviceBuilder *this,
          vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
          *queue_descriptions)

{
  pointer pCVar1;
  vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_> local_28;
  
  local_28.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->info).queue_descriptions.
       super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pCVar1 = (queue_descriptions->
           super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_28.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (this->info).queue_descriptions.
       super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_28.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (this->info).queue_descriptions.
       super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->info).queue_descriptions.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (queue_descriptions->
       super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
       )._M_impl.super__Vector_impl_data._M_start;
  (this->info).queue_descriptions.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = pCVar1;
  (this->info).queue_descriptions.
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (queue_descriptions->
       super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>
       )._M_impl.super__Vector_impl_data._M_end_of_storage;
  (queue_descriptions->
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (queue_descriptions->
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (queue_descriptions->
  super__Vector_base<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<vkb::CustomQueueDescription,_std::allocator<vkb::CustomQueueDescription>_>::~vector
            (&local_28);
  return this;
}

Assistant:

DeviceBuilder& DeviceBuilder::custom_queue_setup(std::vector<CustomQueueDescription> queue_descriptions) {
    info.queue_descriptions = std::move(queue_descriptions);
    return *this;
}